

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O0

UDate __thiscall
icu_63::CalendarAstronomer::riseOrSet
          (CalendarAstronomer *this,CoordFunc *func,UBool rise,double diameter,double refraction,
          double epsilon)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long local_d8;
  double local_b8;
  long delta;
  double y;
  double x;
  double psi;
  double cosD;
  UDate newTime;
  double lst;
  double angle;
  int32_t count;
  double deltaT;
  double tanL;
  Equatorial pos;
  double epsilon_local;
  double refraction_local;
  double diameter_local;
  UBool rise_local;
  CoordFunc *func_local;
  CalendarAstronomer *this_local;
  
  pos.declination = epsilon;
  Equatorial::Equatorial((Equatorial *)&tanL,0.0,0.0);
  dVar2 = tan(this->fLatitude);
  angle._4_4_ = 0;
  do {
    (**func->_vptr_CoordFunc)(func,&tanL,this);
    dVar3 = tan(pos.ascension);
    local_b8 = acos(-dVar2 * dVar3);
    if (rise != '\0') {
      local_b8 = 6.283185307179586 - local_b8;
    }
    dVar4 = lstToUT(this,((local_b8 + tanL) * 24.0) / 6.283185307179586);
    dVar3 = this->fTime;
    setTime(this,dVar4);
    angle._4_4_ = angle._4_4_ + 1;
    bVar1 = false;
    if (angle._4_4_ < 5) {
      dVar3 = uprv_fabs_63(dVar4 - dVar3);
      bVar1 = pos.declination < dVar3;
    }
  } while (bVar1);
  dVar2 = cos(pos.ascension);
  dVar3 = sin(this->fLatitude);
  dVar3 = acos(dVar3 / dVar2);
  dVar4 = sin(diameter / 2.0 + refraction);
  dVar3 = sin(dVar3);
  dVar3 = asin(dVar4 / dVar3);
  local_d8 = (long)(((dVar3 * 240.0 * 57.29577951308232) / dVar2) * 1000.0);
  if (rise != '\0') {
    local_d8 = -local_d8;
  }
  return this->fTime + (double)local_d8;
}

Assistant:

UDate CalendarAstronomer::riseOrSet(CoordFunc& func, UBool rise,
                                    double diameter, double refraction,
                                    double epsilon)
{
    Equatorial pos;
    double      tanL   = ::tan(fLatitude);
    double     deltaT = 0;
    int32_t         count = 0;

    //
    // Calculate the object's position at the current time, then use that
    // position to calculate the time of rising or setting.  The position
    // will be different at that time, so iterate until the error is allowable.
    //
    U_DEBUG_ASTRO_MSG(("setup rise=%s, dia=%.3lf, ref=%.3lf, eps=%.3lf\n",
        rise?"T":"F", diameter, refraction, epsilon));
    do {
        // See "Practical Astronomy With Your Calculator, section 33.
        func.eval(pos, *this);
        double angle = ::acos(-tanL * ::tan(pos.declination));
        double lst = ((rise ? CalendarAstronomer_PI2-angle : angle) + pos.ascension ) * 24 / CalendarAstronomer_PI2;

        // Convert from LST to Universal Time.
        UDate newTime = lstToUT( lst );

        deltaT = newTime - fTime;
        setTime(newTime);
        U_DEBUG_ASTRO_MSG(("%d] dT=%.3lf, angle=%.3lf, lst=%.3lf,   A=%.3lf/D=%.3lf\n",
            count, deltaT, angle, lst, pos.ascension, pos.declination));
    }
    while (++ count < 5 && uprv_fabs(deltaT) > epsilon);

    // Calculate the correction due to refraction and the object's angular diameter
    double cosD  = ::cos(pos.declination);
    double psi   = ::acos(sin(fLatitude) / cosD);
    double x     = diameter / 2 + refraction;
    double y     = ::asin(sin(x) / ::sin(psi));
    long  delta  = (long)((240 * y * RAD_DEG / cosD)*SECOND_MS);

    return fTime + (rise ? -delta : delta);
}